

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridTriangleStrip
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  AdjacencyGrid *pAVar1;
  AdjacencyGridTriangle *pAVar2;
  uint uVar3;
  AdjacencyGridPoint *pAVar4;
  ulong uVar5;
  GLfloat *pGVar6;
  ulong uVar7;
  AdjacencyGridTriangle *pAVar8;
  
  pAVar1 = test_data->m_grid;
  uVar3 = pAVar1->m_n_triangles * 6;
  (pAVar1->m_triangle_strip).m_n_points = uVar3;
  pAVar4 = (AdjacencyGridPoint *)operator_new__((ulong)uVar3 * 0xc);
  (pAVar1->m_triangle_strip).m_points = pAVar4;
  memset(pAVar4,0,(ulong)(pAVar1->m_triangle_strip).m_n_points * 0xc);
  uVar5 = (ulong)(pAVar1->m_triangle_strip).m_n_points;
  if (uVar5 != 0) {
    pAVar2 = pAVar1->m_triangles;
    pAVar4 = (pAVar1->m_triangle_strip).m_points;
    uVar7 = 0;
    pAVar4->index = 0;
    pGVar6 = &pAVar4->y;
    pAVar8 = pAVar2;
    while( true ) {
      pAVar4 = pAVar8->m_vertex_x;
      pGVar6[-1] = pAVar4->x;
      *pGVar6 = pAVar4->y;
      uVar7 = uVar7 + 1;
      if (uVar5 == uVar7) break;
      pGVar6[1] = (GLfloat)uVar7;
      pAVar8 = (AdjacencyGridTriangle *)&pAVar2[(uVar7 & 0xffffffff) / 6].m_vertex_x_adjacent;
      pGVar6 = pGVar6 + 3;
    }
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridTriangleStrip(AdjacencyTestData& test_data)
{
	/* For simplicity, reuse adjacency data we have already defined for single triangles.
	 * This does not make a correct topology, but our point is to verify that shaders
	 * are fed valid values (as per spec), not to confirm rendering works correctly.
	 */
	const int nVerticesPerTriangleStripPrimitive = 6;

	test_data.m_grid->m_triangle_strip.m_n_points =
		test_data.m_grid->m_n_triangles * nVerticesPerTriangleStripPrimitive;
	test_data.m_grid->m_triangle_strip.m_points = new AdjacencyGridPoint[test_data.m_grid->m_triangle_strip.m_n_points];

	memset(test_data.m_grid->m_triangle_strip.m_points, 0,
		   sizeof(AdjacencyGridPoint) * test_data.m_grid->m_triangle_strip.m_n_points);

	for (unsigned int n = 0; n < test_data.m_grid->m_triangle_strip.m_n_points; ++n)
	{
		AdjacencyGridPoint*	pointPtr		 = test_data.m_grid->m_triangle_strip.m_points + n;
		unsigned int		   triangleIndex = n / nVerticesPerTriangleStripPrimitive;
		AdjacencyGridTriangle* trianglePtr   = test_data.m_grid->m_triangles + triangleIndex;

		pointPtr->index = n;

		switch (n % nVerticesPerTriangleStripPrimitive)
		{
		case 0:
			pointPtr->x = trianglePtr->m_vertex_x->x;
			pointPtr->y = trianglePtr->m_vertex_x->y;
			break;
		case 1:
			pointPtr->x = trianglePtr->m_vertex_x_adjacent->x;
			pointPtr->y = trianglePtr->m_vertex_x_adjacent->y;
			break;
		case 2:
			pointPtr->x = trianglePtr->m_vertex_y->x;
			pointPtr->y = trianglePtr->m_vertex_y->y;
			break;
		case 3:
			pointPtr->x = trianglePtr->m_vertex_y_adjacent->x;
			pointPtr->y = trianglePtr->m_vertex_y_adjacent->y;
			break;
		case 4:
			pointPtr->x = trianglePtr->m_vertex_z->x;
			pointPtr->y = trianglePtr->m_vertex_z->y;
			break;
		case 5:
			pointPtr->x = trianglePtr->m_vertex_z_adjacent->x;
			pointPtr->y = trianglePtr->m_vertex_z_adjacent->y;
			break;
		}
	} /* for (all points) */
}